

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  Tokenizer *pTVar1;
  pointer pcVar2;
  bool bVar3;
  LocationRecorder location;
  Token start_token;
  LocationRecorder LStack_78;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  char local_48 [24];
  ColumnNumber local_30;
  
  pTVar1 = this->input_;
  local_60._0_4_ = (pTVar1->current_).type;
  pcVar2 = (pTVar1->current_).text._M_dataplus._M_p;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (pTVar1->current_).text._M_string_length);
  local_30 = (pTVar1->current_).end_column;
  local_48._16_4_ = (pTVar1->current_).line;
  local_48._20_4_ = (pTVar1->current_).column;
  bVar3 = Consume(this,"reserved");
  if (bVar3) {
    if ((this->input_->current_).type == TYPE_STRING) {
      LocationRecorder::LocationRecorder(&LStack_78,message_location,10);
      LocationRecorder::StartAt(&LStack_78,(Token *)local_60);
      bVar3 = ParseReservedNames(this,message,&LStack_78);
    }
    else {
      LocationRecorder::LocationRecorder(&LStack_78,message_location,9);
      LocationRecorder::StartAt(&LStack_78,(Token *)local_60);
      bVar3 = ParseReservedNumbers(this,message,&LStack_78);
    }
    LocationRecorder::~LocationRecorder(&LStack_78);
  }
  else {
    bVar3 = false;
  }
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  return bVar3;
}

Assistant:

bool Parser::ParseReserved(DescriptorProto* message,
                           const LocationRecorder& message_location) {
  io::Tokenizer::Token start_token = input_->current();
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNames(message, location);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedRangeFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNumbers(message, location);
  }
}